

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O1

string * __thiscall
duckdb::Varint::VarcharToVarInt_abi_cxx11_
          (string *__return_storage_ptr__,Varint *this,string_t *value)

{
  char cVar1;
  int iVar2;
  double dVar3;
  _Alloc_hider __nptr;
  bool bVar4;
  int *piVar5;
  ulonglong uVar6;
  pointer pcVar7;
  ConversionException *this_00;
  uint uVar8;
  pointer pcVar9;
  iterator iVar10;
  idx_t iVar11;
  idx_t iVar12;
  long lVar13;
  string *result;
  ulong uVar14;
  Varint *pVVar15;
  long lVar16;
  undefined1 auVar17 [16];
  bool is_negative;
  bool is_zero;
  unsafe_vector<uint64_t> digits;
  string current_number;
  idx_t start_pos;
  idx_t end_pos;
  bool local_ba;
  bool local_b9;
  unsigned_long *local_b8;
  iterator iStack_b0;
  unsigned_long *local_a8;
  string local_a0;
  string *local_80;
  idx_t local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  ulonglong local_68;
  idx_t local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = VarcharFormatting((string_t *)this,&local_78,&local_60,&local_ba,&local_b9);
  if (!bVar4) {
    this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"Could not convert string \'%s\' to Varint","");
    if ((ulong)*(uint *)this < 0xd) {
      pVVar15 = this + 4;
    }
    else {
      pVVar15 = *(Varint **)(this + 8);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pVVar15,pVVar15 + *(uint *)this);
    ConversionException::ConversionException<std::__cxx11::string>(this_00,&local_a0,&local_50);
    __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_b9 == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x04');
    pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar7[0] = -0x80;
    pcVar7[1] = '\0';
    pcVar7[2] = '\x01';
    (__return_storage_ptr__->_M_dataplus)._M_p[3] = '\0';
  }
  else {
    if (*(uint *)this < 0xd) {
      pVVar15 = this + 4;
    }
    else {
      pVVar15 = *(Varint **)(this + 8);
    }
    local_70 = &__return_storage_ptr__->field_2;
    lVar16 = local_60 - local_78;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
    local_80 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x03');
    local_b8 = (unsigned_long *)0x0;
    iStack_b0._M_current = (unsigned_long *)0x0;
    auVar17._8_4_ = (int)((ulong)lVar16 >> 0x20);
    auVar17._0_8_ = lVar16;
    auVar17._12_4_ = 0x45300000;
    local_a8 = (unsigned_long *)0x0;
    dVar3 = ceil(((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.0625);
    __return_storage_ptr__ = local_80;
    for (uVar14 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
        local_80 = __return_storage_ptr__, uVar14 != 0; uVar14 = uVar14 - 1) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      iVar11 = local_60 - 0x10;
      iVar12 = local_78;
      if ((long)local_78 <= (long)iVar11) {
        iVar12 = iVar11;
      }
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,pVVar15 + iVar12,pVVar15 + local_60);
      __nptr._M_p = local_a0._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar6 = strtoull(__nptr._M_p,&local_58,10);
      if (local_58 == __nptr._M_p) {
        ::std::__throw_invalid_argument("stoull");
LAB_002e151a:
        ::std::__throw_out_of_range("stoull");
      }
      if (*piVar5 == 0) {
        *piVar5 = iVar2;
      }
      else if (*piVar5 == 0x22) goto LAB_002e151a;
      local_68 = uVar6;
      if (iStack_b0._M_current == local_a8) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,iStack_b0,
                   &local_68);
      }
      else {
        *iStack_b0._M_current = uVar6;
        iStack_b0._M_current = iStack_b0._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      __return_storage_ptr__ = local_80;
      local_60 = iVar11;
    }
    if (local_b8 != iStack_b0._M_current) {
      do {
        if ((long)iStack_b0._M_current - (long)local_b8 != 0) {
          lVar16 = (long)iStack_b0._M_current - (long)local_b8 >> 3;
          lVar13 = lVar16 + (ulong)(lVar16 == 0);
          uVar14 = 0;
          iVar10._M_current = iStack_b0._M_current;
          do {
            dVar3 = (double)((uint)uVar14 & 0xff) * 1e+16;
            uVar14 = (ulong)dVar3;
            uVar14 = ((long)(dVar3 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14) +
                     local_b8[lVar16 + -1];
            local_b8[lVar16 + -1] = uVar14 >> 8;
            if ((uVar14 < 0x100) && (lVar16 == (long)iVar10._M_current - (long)local_b8 >> 3)) {
              iVar10._M_current = iVar10._M_current + -1;
              iStack_b0._M_current = iVar10._M_current;
            }
            lVar16 = lVar16 + -1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      } while (local_b8 != iStack_b0._M_current);
    }
    if (4 < (long)__return_storage_ptr__->_M_string_length) {
      pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
      pcVar9 = pcVar7 + (__return_storage_ptr__->_M_string_length - 1);
      pcVar7 = pcVar7 + 4;
      do {
        cVar1 = pcVar7[-1];
        pcVar7[-1] = *pcVar9;
        *pcVar9 = cVar1;
        pcVar9 = pcVar9 + -1;
        bVar4 = pcVar7 < pcVar9;
        pcVar7 = pcVar7 + 1;
      } while (bVar4);
    }
    pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar8 = -(uint)local_ba ^ ((int)__return_storage_ptr__->_M_string_length - 3U | 0x800000);
    *pcVar7 = (char)(uVar8 >> 0x10);
    pcVar7[1] = (char)(uVar8 >> 8);
    pcVar7[2] = (char)uVar8;
    if (local_b8 != (unsigned_long *)0x0) {
      operator_delete(local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Varint::VarcharToVarInt(const string_t &value) {
	idx_t start_pos, end_pos;
	bool is_negative, is_zero;
	if (!VarcharFormatting(value, start_pos, end_pos, is_negative, is_zero)) {
		throw ConversionException("Could not convert string \'%s\' to Varint", value.GetString());
	}
	if (is_zero) {
		// Return Value 0
		return InitializeVarintZero();
	}
	auto int_value_char = value.GetData();
	idx_t actual_size = end_pos - start_pos;

	// we initalize result with space for our header
	string result(VARINT_HEADER_SIZE, '0');
	unsafe_vector<uint64_t> digits;

	// The max number a uint64_t can represent is 18.446.744.073.709.551.615
	// That has 20 digits
	// In the worst case a remainder of a division will be 255, which is 3 digits
	// Since the max value is 184, we need to take one more digit out
	// Hence we end up with a max of 16 digits supported.
	constexpr uint8_t max_digits = 16;
	const idx_t number_of_digits = static_cast<idx_t>(std::ceil(static_cast<double>(actual_size) / max_digits));

	// lets convert the string to a uint64_t vector
	idx_t cur_end = end_pos;
	for (idx_t i = 0; i < number_of_digits; i++) {
		idx_t cur_start = static_cast<int64_t>(start_pos) > static_cast<int64_t>(cur_end - max_digits)
		                      ? start_pos
		                      : cur_end - max_digits;
		std::string current_number(int_value_char + cur_start, cur_end - cur_start);
		digits.push_back(std::stoull(current_number));
		// move cur_end to more digits down the road
		cur_end = cur_end - max_digits;
	}

	// Now that we have our uint64_t vector, lets start our division process to figure out the new number and remainder
	while (!digits.empty()) {
		idx_t digit_idx = digits.size() - 1;
		uint8_t remainder = 0;
		idx_t digits_size = digits.size();
		for (idx_t i = 0; i < digits_size; i++) {
			digits[digit_idx] += static_cast<uint64_t>(remainder * pow(10, max_digits));
			remainder = static_cast<uint8_t>(digits[digit_idx] % 256);
			digits[digit_idx] /= 256;
			if (digits[digit_idx] == 0 && digit_idx == digits.size() - 1) {
				// we can cap this
				digits.pop_back();
			}
			digit_idx--;
		}
		if (is_negative) {
			result.push_back(static_cast<char>(~remainder));
		} else {
			result.push_back(static_cast<char>(remainder));
		}
	}
	std::reverse(result.begin() + VARINT_HEADER_SIZE, result.end());
	// Set header after we know the size of the varint
	SetHeader(&result[0], result.size() - VARINT_HEADER_SIZE, is_negative);
	return result;
}